

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

MockSpec<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> * __thiscall
testing::internal::FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>::With
          (FunctionMocker<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)> *this,Matcher<int> *m1)

{
  MatcherBase<int> local_20;
  
  Matcher<int>::Matcher((Matcher<int> *)&local_20,m1);
  linked_ptr<const_testing::MatcherInterface<int>_>::operator=
            ((linked_ptr<const_testing::MatcherInterface<int>_> *)
             ((long)&(this->super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>).
                     current_spec_.matchers_.super__Tuple_impl<0UL,_testing::Matcher<int>_>.
                     super__Head_base<0UL,_testing::Matcher<int>,_false>._M_head_impl.
                     super_MatcherBase<int> + 8),&local_20.impl_);
  MatcherBase<int>::~MatcherBase(&local_20);
  return &(this->super_FunctionMockerBase<TestExprBuilder<3,_BasicTestExpr<2>_>_(int)>).
          current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1));
    return this->current_spec();
  }